

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O1

KeyboardModifiers QXkbCommon::modifiers(xkb_state *state,xkb_keysym_t keysym)

{
  QFlagsStorage<Qt::KeyboardModifier> QVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QFlagsStorage<Qt::KeyboardModifier> QVar6;
  uint uVar7;
  uint uVar8;
  
  iVar2 = xkb_state_mod_name_is_active(state,"Control",8);
  iVar3 = xkb_state_mod_name_is_active(state,"Mod1",8);
  iVar4 = xkb_state_mod_name_is_active(state,"Shift",8);
  iVar5 = xkb_state_mod_name_is_active(state,"Mod4",8);
  uVar7 = (uint)(0 < iVar2) * 0x4000000;
  uVar8 = uVar7 + 0x8000000;
  if (iVar3 < 1) {
    uVar8 = uVar7;
  }
  uVar7 = uVar8 + 0x2000000;
  if (iVar4 < 1) {
    uVar7 = uVar8;
  }
  QVar1.i = uVar7 | 0x10000000;
  if (iVar5 < 1) {
    QVar1.i = uVar7;
  }
  QVar6.i = QVar1.i | 0x20000000;
  if ((0x23fffc00fffe2201U >> ((byte)keysym & 0x3f) & 1) == 0) {
    QVar6.i = QVar1.i;
  }
  if (0x3d < keysym - 0xff80) {
    QVar6.i = QVar1.i;
  }
  return (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
         (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)QVar6.i;
}

Assistant:

Qt::KeyboardModifiers QXkbCommon::modifiers(struct xkb_state *state, xkb_keysym_t keysym)
{
    Qt::KeyboardModifiers modifiers = Qt::NoModifier;

    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_CTRL, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::ControlModifier;
    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_ALT, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::AltModifier;
    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_SHIFT, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::ShiftModifier;
    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_LOGO, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::MetaModifier;

    if (isKeypad(keysym))
        modifiers |= Qt::KeypadModifier;

    return modifiers;
}